

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int mem_expr_eq(mem_expr_t e1,mem_expr_t e2,void *arg)

{
  MIR_insn_t pMVar1;
  MIR_insn_t pMVar2;
  void *pvVar3;
  bb_insn_t_conflict pbVar4;
  int iVar5;
  MIR_type_t MVar6;
  MIR_type_t MVar7;
  bool local_51;
  ssa_edge_t_conflict ssa_edge2;
  ssa_edge_t_conflict ssa_edge1;
  MIR_op_t *op_ref2;
  MIR_op_t *op_ref1;
  MIR_insn_t st2;
  MIR_insn_t st1;
  void *arg_local;
  mem_expr_t e2_local;
  mem_expr_t e1_local;
  
  pMVar1 = e1->insn;
  pMVar2 = e2->insn;
  op_ref2 = pMVar1->ops;
  ssa_edge1 = (ssa_edge_t_conflict)pMVar2->ops;
  iVar5 = move_code_p((MIR_insn_code_t)*(undefined8 *)&pMVar1->field_0x18);
  if (iVar5 != 0) {
    iVar5 = move_code_p((MIR_insn_code_t)*(undefined8 *)&pMVar2->field_0x18);
    if (iVar5 != 0) {
      if ((*(ushort *)&pMVar1->ops[0].field_0x8 & 0xff) != 0xb) {
        op_ref2 = (MIR_op_t *)(pMVar1 + 1);
      }
      if ((*(ushort *)&pMVar2->ops[0].field_0x8 & 0xff) != 0xb) {
        ssa_edge1 = (ssa_edge_t_conflict)(pMVar2 + 1);
      }
      if (((*(ushort *)&op_ref2->field_0x8 & 0xff) == 0xb) &&
         (((ulong)ssa_edge1->def & 0xff) == 0xb)) {
        pvVar3 = op_ref2->data;
        pbVar4 = ssa_edge1->use;
        local_51 = false;
        if ((((pvVar3 != (void *)0x0) && (local_51 = false, pbVar4 != (bb_insn_t_conflict)0x0)) &&
            (local_51 = false,
            *(char *)(*(long *)((long)pvVar3 + 8) + 8) ==
            *(char *)(*(long *)&pbVar4->gvn_val_const_p + 8))) &&
           (local_51 = false,
           *(long *)(*(long *)((long)pvVar3 + 8) + 0x18) ==
           *(long *)(*(long *)&pbVar4->gvn_val_const_p + 0x18))) {
          MVar6 = canonic_mem_type((uint)*(byte *)&op_ref2->u);
          MVar7 = canonic_mem_type((uint)(byte)ssa_edge1->flag);
          local_51 = false;
          if ((MVar6 == MVar7) &&
             (local_51 = false, (op_ref2->u).mem.alias == ssa_edge1->use_op_num)) {
            local_51 = (op_ref2->u).mem.nonalias == *(MIR_alias_t *)&ssa_edge1->prev_use;
          }
        }
        return (int)local_51;
      }
      __assert_fail("op_ref1->mode == MIR_OP_VAR_MEM && op_ref2->mode == MIR_OP_VAR_MEM",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0xe6c,"int mem_expr_eq(mem_expr_t, mem_expr_t, void *)");
    }
  }
  __assert_fail("move_code_p (st1->code) && move_code_p (st2->code)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xe69,"int mem_expr_eq(mem_expr_t, mem_expr_t, void *)");
}

Assistant:

static int mem_expr_eq (mem_expr_t e1, mem_expr_t e2, void *arg MIR_UNUSED) {
  MIR_insn_t st1 = e1->insn, st2 = e2->insn;
  MIR_op_t *op_ref1 = &st1->ops[0], *op_ref2 = &st2->ops[0];
  ssa_edge_t ssa_edge1, ssa_edge2;

  gen_assert (move_code_p (st1->code) && move_code_p (st2->code));
  if (op_ref1->mode != MIR_OP_VAR_MEM) op_ref1 = &st1->ops[1];
  if (op_ref2->mode != MIR_OP_VAR_MEM) op_ref2 = &st2->ops[1];
  gen_assert (op_ref1->mode == MIR_OP_VAR_MEM && op_ref2->mode == MIR_OP_VAR_MEM);
  ssa_edge1 = op_ref1->data;
  ssa_edge2 = op_ref2->data;
  return (ssa_edge1 != NULL && ssa_edge2 != NULL
          && ssa_edge1->def->gvn_val_const_p == ssa_edge2->def->gvn_val_const_p
          && ssa_edge1->def->gvn_val == ssa_edge2->def->gvn_val
          && canonic_mem_type (op_ref1->u.var_mem.type)
               == canonic_mem_type (op_ref2->u.var_mem.type)
          && op_ref1->u.var_mem.alias == op_ref2->u.var_mem.alias
          && op_ref1->u.var_mem.nonalias == op_ref2->u.var_mem.nonalias);
}